

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::expandRecursively(QTreeView *this,QModelIndex *index,int depth)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  QTreeViewPrivate *this_00;
  int in_EDX;
  QModelIndex *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int row;
  int rowCount;
  int curDepth;
  QModelIndex *parent;
  QTreeViewPrivate *d;
  QModelIndex child;
  QStack<std::pair<QModelIndex,_int>_> parents;
  pair<QModelIndex,_int> elem;
  pair<QModelIndex,_int> *in_stack_fffffffffffffef8;
  QTreeViewPrivate *in_stack_ffffffffffffff00;
  QTreeViewPrivate *this_01;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff18;
  int iVar4;
  int iVar5;
  QModelIndex *in_stack_ffffffffffffff28;
  undefined1 **ppuVar6;
  QPersistentModelIndex local_b0;
  int local_a4;
  QModelIndex local_a0;
  int local_84;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  pair<QModelIndex,_int> local_68;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  pair<QModelIndex,_int> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8f9cf9);
  if (-2 < in_EDX) {
    QAbstractItemViewPrivate::doDelayedItemsLayout
              (&in_RDI->super_QAbstractItemViewPrivate,in_stack_ffffffffffffff0c);
    expand((QTreeView *)this_00,in_stack_ffffffffffffff28);
    if (in_EDX != 0) {
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QStack<std::pair<QModelIndex,_int>_>::QStack((QStack<std::pair<QModelIndex,_int>_> *)0x8f9d6b)
      ;
      local_84 = 0;
      std::pair<QModelIndex,_int>::pair<int,_true>(&local_28,in_RSI,&local_84);
      QStack<std::pair<QModelIndex,_int>_>::push
                ((QStack<std::pair<QModelIndex,_int>_> *)in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8);
LAB_008f9da5:
      bVar2 = QList<std::pair<QModelIndex,_int>_>::isEmpty
                        ((QList<std::pair<QModelIndex,_int>_> *)0x8f9db2);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        QStack<std::pair<QModelIndex,_int>_>::pop
                  ((QStack<std::pair<QModelIndex,_int>_> *)in_stack_ffffffffffffff00);
        ppuVar6 = &local_48;
        pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
        iVar5 = (int)local_30;
        iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,ppuVar6);
        for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
          local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a0.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          local_a0.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_a0,pQVar1,iVar4,0,ppuVar6);
          bVar2 = QAbstractItemViewPrivate::isIndexValid
                            (&in_RDI->super_QAbstractItemViewPrivate,
                             (QModelIndex *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          if (!bVar2) break;
          if ((in_EDX == -1) || (this_01 = this_00, iVar5 + 1 < in_EDX)) {
            local_a4 = iVar5 + 1;
            std::pair<QModelIndex,_int>::pair<int,_true>(&local_68,&local_a0,&local_a4);
            QStack<std::pair<QModelIndex,_int>_>::push
                      ((QStack<std::pair<QModelIndex,_int>_> *)in_stack_ffffffffffffff00,
                       in_stack_fffffffffffffef8);
            this_01 = this_00;
          }
          bVar2 = QTreeViewPrivate::isIndexExpanded
                            ((QTreeViewPrivate *)CONCAT44(iVar5,iVar3),
                             (QModelIndex *)CONCAT44(iVar4,in_stack_ffffffffffffff18));
          this_00 = this_01;
          if (!bVar2) {
            QPersistentModelIndex::QPersistentModelIndex(&local_b0,(QModelIndex *)&local_a0);
            bVar2 = QTreeViewPrivate::storeExpanded
                              (in_RDI,(QPersistentModelIndex *)
                                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
            ;
            in_stack_ffffffffffffff0c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff0c);
            QPersistentModelIndex::~QPersistentModelIndex(&local_b0);
            in_stack_ffffffffffffff00 = this_01;
            if ((in_stack_ffffffffffffff0c & 0x1000000) != 0) {
              expanded((QTreeView *)this_01,&in_stack_fffffffffffffef8->first);
              in_stack_ffffffffffffff00 = this_01;
            }
          }
        }
        goto LAB_008f9da5;
      }
      QStack<std::pair<QModelIndex,_int>_>::~QStack
                ((QStack<std::pair<QModelIndex,_int>_> *)0x8f9f99);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::expandRecursively(const QModelIndex &index, int depth)
{
    Q_D(QTreeView);

    if (depth < -1)
        return;
    // do layouting only once after expanding is done
    d->doDelayedItemsLayout();
    expand(index);
    if (depth == 0)
        return;
    QStack<std::pair<QModelIndex, int>> parents;
    parents.push({index, 0});
    while (!parents.isEmpty()) {
        const std::pair<QModelIndex, int> elem = parents.pop();
        const QModelIndex &parent = elem.first;
        const int curDepth = elem.second;
        const int rowCount = d->model->rowCount(parent);
        for (int row = 0; row < rowCount; ++row) {
            const QModelIndex child = d->model->index(row, 0, parent);
            if (!d->isIndexValid(child))
                break;
            if (depth == -1 || curDepth + 1 < depth)
                parents.push({child, curDepth + 1});
            if (d->isIndexExpanded(child))
                continue;
            if (d->storeExpanded(child))
                emit expanded(child);
        }
    }
}